

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O3

void Abc_FlowRetime_InitTiming(Abc_Ntk_t *pNtk)

{
  MinRegMan_t *pMVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  pMVar1 = pManMR;
  pMVar1->nExactConstraints = 0;
  pMVar1->nConservConstraints = 0;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pMVar1->vExactNodes = pVVar2;
  pVVar2 = (Vec_Ptr_t *)calloc(1,(long)pNtk->vObjs->nSize * 0x10 + 0x10);
  pMVar1->vTimeEdges = pVVar2;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    return;
  }
  __assert_fail("pManMR->vTimeEdges",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretTime.c"
                ,0x4a,"void Abc_FlowRetime_InitTiming(Abc_Ntk_t *)");
}

Assistant:

void Abc_FlowRetime_InitTiming( Abc_Ntk_t *pNtk ) {

  pManMR->nConservConstraints = pManMR->nExactConstraints = 0;

  pManMR->vExactNodes = Vec_PtrAlloc(1000);

  pManMR->vTimeEdges = ABC_ALLOC( Vec_Ptr_t, Abc_NtkObjNumMax(pNtk)+1 );
  assert(pManMR->vTimeEdges);
  memset(pManMR->vTimeEdges, 0, (Abc_NtkObjNumMax(pNtk)+1) * sizeof(Vec_Ptr_t) );
}